

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

FString C_GetMassCVarString(DWORD filter,bool compact)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FString *pFVar3;
  undefined4 extraout_var_00;
  char *tail;
  byte in_DL;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  FString *this;
  UCVarValue val_1;
  UCVarValue val;
  undefined1 local_38 [8];
  TArray<FBaseCVar_*,_FBaseCVar_*> cvars;
  FBaseCVar *local_20;
  FBaseCVar *cvar;
  bool compact_local;
  FString *pFStack_10;
  DWORD filter_local;
  FString *dump;
  
  this = (FString *)CONCAT44(in_register_0000003c,filter);
  cvar._4_4_ = (uint)CONCAT71(in_register_00000031,compact);
  cvar._3_1_ = in_DL & 1;
  cvars.Count._3_1_ = 0;
  pFStack_10 = this;
  FString::FString(this);
  if ((cvar._3_1_ & 1) == 0) {
    for (local_20 = CVars; local_20 != (FBaseCVar *)0x0; local_20 = local_20->m_Next) {
      if (((local_20->Flags & cvar._4_4_) != 0) && ((local_20->Flags & 0x5000) == 0)) {
        iVar2 = (*local_20->_vptr_FBaseCVar[4])(local_20,3);
        pFVar3 = FString::operator<<(this,'\\');
        tail = FBaseCVar::GetName(local_20);
        pFVar3 = FString::operator<<(pFVar3,tail);
        pFVar3 = FString::operator<<(pFVar3,'\\');
        FString::operator<<(pFVar3,(char *)CONCAT44(extraout_var_00,iVar2));
      }
    }
  }
  else {
    TArray<FBaseCVar_*,_FBaseCVar_*>::TArray((TArray<FBaseCVar_*,_FBaseCVar_*> *)local_38);
    FString::AppendFormat(this,"\\\\%ux",(ulong)cvar._4_4_);
    FilterCompactCVars((TArray<FBaseCVar_*,_FBaseCVar_*> *)local_38,cvar._4_4_);
    while (bVar1 = TArray<FBaseCVar_*,_FBaseCVar_*>::Pop
                             ((TArray<FBaseCVar_*,_FBaseCVar_*> *)local_38,&local_20), bVar1) {
      iVar2 = (*local_20->_vptr_FBaseCVar[4])(local_20,3);
      pFVar3 = FString::operator<<(this,'\\');
      FString::operator<<(pFVar3,(char *)CONCAT44(extraout_var,iVar2));
    }
    TArray<FBaseCVar_*,_FBaseCVar_*>::~TArray((TArray<FBaseCVar_*,_FBaseCVar_*> *)local_38);
  }
  return (FString)(char *)this;
}

Assistant:

FString C_GetMassCVarString (DWORD filter, bool compact)
{
	FBaseCVar *cvar;
	FString dump;

	if (compact)
	{
		TArray<FBaseCVar *> cvars;
		dump.AppendFormat("\\\\%ux", filter);
		FilterCompactCVars(cvars, filter);
		while (cvars.Pop (cvar))
		{
			UCVarValue val = cvar->GetGenericRep(CVAR_String);
			dump << '\\' << val.String;
		}
	}
	else
	{
		for (cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
		{
			if ((cvar->Flags & filter) && !(cvar->Flags & (CVAR_NOSAVE|CVAR_IGNORE)))
			{
				UCVarValue val = cvar->GetGenericRep(CVAR_String);
				dump << '\\' << cvar->GetName() << '\\' << val.String;
			}
		}
	}
	return dump;
}